

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alstring.cpp
# Opt level: O0

int al::strncasecmp(char *__s1,char *__s2,size_t __n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  int diff;
  size_t local_20;
  char *local_18;
  char *local_10;
  
  local_20 = __n;
  local_18 = __s2;
  local_10 = __s1;
  if (__n != 0) {
    do {
      iVar2 = anon_unknown.dwarf_25ed58::to_upper('\0');
      iVar3 = anon_unknown.dwarf_25ed58::to_upper('\0');
      if (iVar2 - iVar3 < 0) {
        return -1;
      }
      if (0 < iVar2 - iVar3) {
        return 1;
      }
      local_20 = local_20 - 1;
      bVar5 = false;
      if (local_20 != 0) {
        pcVar4 = local_10 + 1;
        cVar1 = *local_10;
        bVar5 = false;
        local_10 = pcVar4;
        if (cVar1 != '\0') {
          bVar5 = *local_18 != '\0';
          local_18 = local_18 + 1;
        }
      }
    } while (bVar5);
  }
  return 0;
}

Assistant:

int strncasecmp(const char *str0, const char *str1, std::size_t len) noexcept
{
    if(len > 0)
    {
        do {
            const int diff{to_upper(*str0) - to_upper(*str1)};
            if(diff < 0) return -1;
            if(diff > 0) return 1;
        } while(--len && *(str0++) && *(str1++));
    }
    return 0;
}